

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

void __thiscall
FxCompareEq::EmitCompare
          (FxCompareEq *this,VMFunctionBuilder *build,bool invert,
          TArray<unsigned_long,_unsigned_long> *patchspots_yes,
          TArray<unsigned_long,_unsigned_long> *patchspots_no)

{
  uint uVar1;
  ExpEmit EVar2;
  size_t sVar3;
  
  EVar2 = EmitCommon(this,build,true,invert);
  if (((ulong)EVar2 & 0x10100fc0000) == 0) {
    VMFunctionBuilder::RegAvailability::Return
              (build->Registers + (EVar2._2_4_ & 3),EVar2._0_4_ & 0xffff,EVar2._3_4_ & 0xff);
  }
  sVar3 = VMFunctionBuilder::Emit(build,0x44,0);
  TArray<unsigned_long,_unsigned_long>::Grow(patchspots_no,1);
  uVar1 = patchspots_no->Count;
  patchspots_no->Array[uVar1] = sVar3;
  patchspots_no->Count = uVar1 + 1;
  return;
}

Assistant:

void FxCompareEq::EmitCompare(VMFunctionBuilder *build, bool invert, TArray<size_t> &patchspots_yes, TArray<size_t> &patchspots_no)
{
	ExpEmit emit = EmitCommon(build, true, invert);
	emit.Free(build);
	patchspots_no.Push(build->Emit(OP_JMP, 0));
}